

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

bool __thiscall ghc::filesystem::path::has_root_path(path *this)

{
  size_type sVar1;
  bool bVar2;
  
  sVar1 = root_name_length(this);
  bVar2 = true;
  if (sVar1 == 0) {
    sVar1 = root_name_length(this);
    if (sVar1 < (this->_path)._M_string_length) {
      bVar2 = (this->_path)._M_dataplus._M_p[sVar1] == '/';
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

GHC_INLINE bool path::has_root_path() const
{
    return has_root_name() || has_root_directory();
}